

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_dfs.c
# Opt level: O2

lu_int lu_dfs(lu_int i,lu_int *begin,lu_int *end,lu_int *index,lu_int top,lu_int *xi,lu_int *pstack,
             lu_int *marked,lu_int M)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int *piVar8;
  
  if (marked[i] != M) {
    *xi = i;
    if (end == (lu_int *)0x0) {
      uVar3 = 0;
      while( true ) {
        iVar2 = (int)uVar3;
        if (iVar2 < 0) break;
        iVar4 = xi[uVar3];
        if (marked[iVar4] == M) {
          iVar5 = pstack[uVar3];
        }
        else {
          marked[iVar4] = M;
          iVar5 = begin[iVar4];
          pstack[uVar3] = iVar5;
        }
        piVar8 = index + iVar5;
        while( true ) {
          iVar5 = iVar5 + 1;
          iVar1 = *piVar8;
          if ((long)iVar1 < 0) break;
          if (marked[iVar1] != M) {
            pstack[uVar3] = iVar5;
            uVar3 = (ulong)(iVar2 + 1);
            uVar7 = uVar3;
            iVar4 = iVar1;
            goto LAB_0039143a;
          }
          piVar8 = piVar8 + 1;
        }
        uVar3 = (ulong)(iVar2 - 1);
        top = top + -1;
        uVar7 = (ulong)top;
LAB_0039143a:
        xi[uVar7] = iVar4;
      }
    }
    else {
      uVar3 = 0;
      while( true ) {
        iVar2 = (int)uVar3;
        if (iVar2 < 0) break;
        iVar4 = xi[uVar3];
        if (marked[iVar4] == M) {
          iVar5 = pstack[uVar3];
        }
        else {
          marked[iVar4] = M;
          iVar5 = begin[iVar4];
          pstack[uVar3] = iVar5;
        }
        for (lVar6 = (long)iVar5; iVar5 = iVar5 + 1, lVar6 < end[iVar4]; lVar6 = lVar6 + 1) {
          iVar1 = index[lVar6];
          if (marked[iVar1] != M) {
            pstack[uVar3] = iVar5;
            uVar3 = (ulong)(iVar2 + 1);
            uVar7 = uVar3;
            iVar4 = iVar1;
            goto LAB_003913d3;
          }
        }
        uVar3 = (ulong)(iVar2 - 1);
        top = top + -1;
        uVar7 = (ulong)top;
LAB_003913d3:
        xi[uVar7] = iVar4;
      }
    }
  }
  return top;
}

Assistant:

lu_int lu_dfs(
    lu_int i, const lu_int *begin, const lu_int *end, const lu_int *index,
    lu_int top, lu_int *xi, lu_int *pstack, lu_int *marked, const lu_int M)
{
    if (marked[i] == M)
        return top;

    return end ?
        dfs_end(i, begin, end, index, top, xi, pstack, marked, M) :
        dfs(i, begin, index, top, xi, pstack, marked, M);
}